

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

ZoneState * __thiscall
QTimeZonePrivate::stateAtZoneTime
          (ZoneState *__return_storage_ptr__,QTimeZonePrivate *this,qint64 forLocalMSecs,
          TransitionOptions resolve)

{
  int *piVar1;
  QArrayData *data;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  DaylightStatus DVar7;
  uint uVar8;
  undefined1 *puVar9;
  long lVar10;
  undefined1 *puVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView lhs;
  Data newTran;
  Data nextTran;
  Data future;
  Data past;
  QString local_128;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  int local_108;
  undefined4 uStack_104;
  int iStack_100;
  undefined4 uStack_fc;
  QString local_f8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  int iStack_d0;
  undefined4 uStack_cc;
  QString local_c8;
  undefined1 *local_b0;
  undefined1 *puStack_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar13 = forLocalMSecs + -61200000;
  if (SCARRY8(forLocalMSecs,-61200000)) {
    lVar13 = -0x7fffffffffffffff;
  }
  if (forLocalMSecs == -0x7ffffffffc5a2980) {
    lVar13 = -0x7fffffffffffffff;
  }
  lVar14 = forLocalMSecs + 61200000;
  if (SCARRY8(forLocalMSecs,61200000)) {
    lVar14 = 0x7fffffffffffffff;
  }
  local_48 = -0x55555556;
  iStack_44 = -0x55555556;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  (*this->_vptr_QTimeZonePrivate[0xd])(&local_68,this,lVar13);
  local_78 = -0x55555556;
  iStack_74 = -0x55555556;
  iStack_70 = -0x55555556;
  uStack_6c = 0xaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  local_98 = 0xaaaaaaaa;
  uStack_94 = 0xaaaaaaaa;
  uStack_90 = 0xaaaaaaaa;
  uStack_8c = 0xaaaaaaaa;
  (*this->_vptr_QTimeZonePrivate[0xd])(&local_98,this,lVar14);
  iVar4 = local_48;
  if ((CONCAT44(uStack_7c,uStack_80) == -0x8000000000000000) &&
     (CONCAT44(uStack_4c,uStack_50) == -0x8000000000000000)) goto LAB_003f451a;
  if ((local_48 == local_78) &&
     (((iStack_44 == iStack_74 &&
       (lVar13 = CONCAT44(uStack_54,local_58), lVar13 == CONCAT44(uStack_84,local_88))) &&
      (lhs.m_data._4_4_ = uStack_5c, lhs.m_data._0_4_ = uStack_60, rhs.m_data._4_4_ = uStack_8c,
      rhs.m_data._0_4_ = uStack_90, rhs.m_size = lVar13, lhs.m_size = lVar13,
      bVar3 = QtPrivate::equalStrings(lhs,rhs), bVar3)))) {
    data = (QArrayData *)CONCAT44(uStack_94,local_98);
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      iVar4 = local_78;
    }
    __return_storage_ptr__->when = forLocalMSecs;
    __return_storage_ptr__->offset = iVar4;
    __return_storage_ptr__->dst = (uint)(iStack_70 != 0);
    __return_storage_ptr__->valid = true;
    if (data == (QArrayData *)0x0) goto LAB_003f45e0;
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar4 = (data->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    iVar4 = (*this->_vptr_QTimeZonePrivate[0x10])(this);
    if ((char)iVar4 == '\0') {
LAB_003f4852:
      iVar2 = local_48;
      iVar4 = local_78;
      lVar14 = (long)local_48;
      lVar13 = (long)local_78;
      if (local_78 == local_48) {
        lVar10 = forLocalMSecs + lVar14 * -1000;
        if (SBORROW8(forLocalMSecs,lVar14 * 1000)) {
LAB_003f451a:
          __return_storage_ptr__->when = forLocalMSecs;
          __return_storage_ptr__->offset = 0;
          __return_storage_ptr__->dst = UnknownDaylightTime;
          __return_storage_ptr__->valid = false;
          goto LAB_003f45e0;
        }
      }
      else {
        lVar14 = forLocalMSecs + lVar14 * -1000;
        iVar5 = (*this->_vptr_QTimeZonePrivate[8])(this);
        lVar13 = forLocalMSecs + lVar13 * -1000;
        iVar6 = (*this->_vptr_QTimeZonePrivate[8])(this);
        if (iVar5 == iVar2) {
          lVar10 = lVar14;
          if ((((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                      super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x20) == 0 &&
               iVar6 == iVar4) &&
             (lVar10 = lVar13,
             ((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                    super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x40) == 0))
          goto LAB_003f451a;
        }
        else {
          lVar10 = lVar13;
          if (iVar6 != iVar4) {
            iVar4 = (iVar4 - iVar2) * 1000;
            if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                       super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 2) == 0) {
              if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                         super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 4) == 0)
              goto LAB_003f451a;
              lVar10 = lVar13 + iVar4;
            }
            else {
              lVar10 = lVar14 - iVar4;
            }
          }
        }
      }
      (*this->_vptr_QTimeZonePrivate[0xd])(&local_c8,this,lVar10);
      __return_storage_ptr__->when = (qint64)(local_b0 + (long)(int)puStack_a8 * 1000);
      __return_storage_ptr__->offset = (int)puStack_a8;
      __return_storage_ptr__->dst = (uint)((int)local_a0 != 0);
      __return_storage_ptr__->valid = true;
    }
    else {
      local_c8.d.d = (Data *)CONCAT44(uStack_64,local_68);
      local_c8.d.ptr = (char16_t *)CONCAT44(uStack_5c,uStack_60);
      local_c8.d.size = CONCAT44(uStack_54,local_58);
      if ((QArrayData *)local_c8.d.d != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)local_c8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)local_c8.d.d)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a0 = CONCAT44(0xaaaaaaaa,uStack_40);
      local_b0 = (undefined1 *)CONCAT44(uStack_4c,uStack_50);
      puStack_a8 = (undefined1 *)CONCAT44(iStack_44,local_48);
      local_d8 = &DAT_aaaaaaaaaaaaaaaa;
      iStack_d0 = -0x55555556;
      uStack_cc = 0xaaaaaaaa;
      local_f8.d.size._0_4_ = 0xaaaaaaaa;
      local_f8.d.size._4_4_ = 0xaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8.d.d._0_4_ = 0xaaaaaaaa;
      local_f8.d.d._4_4_ = 0xaaaaaaaa;
      local_f8.d.ptr._0_4_ = 0xaaaaaaaa;
      local_f8.d.ptr._4_4_ = 0xaaaaaaaa;
      (*this->_vptr_QTimeZonePrivate[0x11])(&local_f8,this,local_b0);
      do {
        if (puStack_e0 == (undefined1 *)0x8000000000000000) {
          puVar9 = (undefined1 *)0x8000000000000000;
          break;
        }
        puVar9 = puStack_e0;
        if (forLocalMSecs <= (long)(puStack_e0 + (long)(int)local_d8 * 1000)) break;
        local_108 = -0x55555556;
        uStack_104 = 0xaaaaaaaa;
        iStack_100 = -0x55555556;
        uStack_fc = 0xaaaaaaaa;
        local_128.d.size._0_4_ = 0xaaaaaaaa;
        local_128.d.size._4_4_ = 0xaaaaaaaa;
        uStack_110 = 0xaaaaaaaa;
        uStack_10c = 0xaaaaaaaa;
        local_128.d.d._0_4_ = 0xaaaaaaaa;
        local_128.d.d._4_4_ = 0xaaaaaaaa;
        local_128.d.ptr._0_4_ = 0xaaaaaaaa;
        local_128.d.ptr._4_4_ = 0xaaaaaaaa;
        (*this->_vptr_QTimeZonePrivate[0x11])(&local_128,this);
        if ((CONCAT44(uStack_10c,uStack_110) == -0x8000000000000000) ||
           (lVar14 < CONCAT44(uStack_10c,uStack_110) + (long)local_108 * 1000)) {
          bVar3 = false;
        }
        else {
          QString::operator=(&local_c8,&local_f8);
          local_b0 = puStack_e0;
          puStack_a8 = local_d8;
          local_a0 = CONCAT44(local_a0._4_4_,iStack_d0);
          QString::operator=(&local_f8,&local_128);
          puStack_e0 = (undefined1 *)CONCAT44(uStack_10c,uStack_110);
          local_d8 = (undefined1 *)CONCAT44(uStack_104,local_108);
          iStack_d0 = iStack_100;
          bVar3 = true;
        }
        piVar1 = (int *)CONCAT44(local_128.d.d._4_4_,local_128.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_128.d.d._4_4_,local_128.d.d._0_4_),2,0x10);
          }
        }
        puVar9 = puStack_e0;
      } while (bVar3);
      if (local_b0 == (undefined1 *)0x8000000000000000) {
LAB_003f4806:
        piVar1 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
          }
        }
        if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_003f4852;
      }
      local_b0 = (undefined1 *)(forLocalMSecs + (long)(int)puStack_a8 * -1000);
      iVar4 = (int)puStack_a8;
      if (puVar9 == (undefined1 *)0x8000000000000000) {
        if ((int)puStack_a8 == local_78) goto LAB_003f4930;
        goto LAB_003f4806;
      }
      if (local_b0 == (undefined1 *)0x8000000000000000) goto LAB_003f4806;
      puVar11 = (undefined1 *)(forLocalMSecs + (long)(int)local_d8 * -1000);
      puStack_e0 = puVar11;
      if ((long)puVar11 < (long)puVar9) {
        if ((long)local_b0 < (long)puVar9) {
LAB_003f4930:
          DVar7 = (DaylightStatus)((int)local_a0 != 0);
          bVar3 = true;
        }
        else {
          if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                     super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) == 0) {
            uVar8 = 0xfffffffb;
            uVar12 = 0xfffffffd;
          }
          else {
            uVar8 = (uint)(iStack_d0 == 0 && (int)local_a0 != 0) * 2 - 5;
            uVar12 = (uint)(iStack_d0 != 0 || (int)local_a0 == 0) * 2 - 5;
          }
          puStack_e0 = local_b0;
          if ((uVar8 | (uint)resolve.
                             super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                             super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) ==
              0xffffffff) {
            forLocalMSecs = (qint64)(local_b0 + (long)(int)local_d8 * 1000);
            local_b0 = puVar11;
            goto LAB_003f4b45;
          }
          if ((uVar12 | (uint)resolve.
                              super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                              super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) ==
              0xffffffff) {
            forLocalMSecs = (qint64)(puVar11 + (long)(int)puStack_a8 * 1000);
            DVar7 = (DaylightStatus)((int)local_a0 != 0);
            bVar3 = true;
            local_b0 = puVar11;
          }
          else {
LAB_003f4b18:
            local_b0 = puVar11;
            DVar7 = UnknownDaylightTime;
            iVar4 = 0;
            bVar3 = false;
          }
        }
      }
      else {
        if ((long)local_b0 < (long)puVar9) {
          if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                     super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) == 0) {
            uVar8 = 0xffffffbf;
            uVar12 = 0xffffffdf;
          }
          else {
            uVar8 = (uint)(iStack_d0 != 0 && (int)local_a0 == 0) * 0x20 - 0x41;
            uVar12 = (uint)(iStack_d0 == 0 || (int)local_a0 != 0) * 0x20 - 0x41;
          }
          if ((uVar8 | (uint)resolve.
                             super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                             super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) !=
              0xffffffff) {
            puVar11 = local_b0;
            if ((uVar12 | (uint)resolve.
                                super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                                super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) !=
                0xffffffff) goto LAB_003f4b18;
            goto LAB_003f4930;
          }
        }
LAB_003f4b45:
        DVar7 = (DaylightStatus)(iStack_d0 != 0);
        bVar3 = true;
        iVar4 = (int)local_d8;
      }
      __return_storage_ptr__->when = forLocalMSecs;
      __return_storage_ptr__->offset = iVar4;
      __return_storage_ptr__->dst = DVar7;
      __return_storage_ptr__->valid = bVar3;
      piVar1 = (int *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_f8.d.d._4_4_,local_f8.d.d._0_4_),2,0x10);
        }
      }
    }
    if (&(local_c8.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_003f45e0;
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar4 = ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    data = &(local_c8.d.d)->super_QArrayData;
  }
  if (iVar4 == 0) {
    QArrayData::deallocate(data,2,0x10);
  }
LAB_003f45e0:
  piVar1 = (int *)CONCAT44(uStack_94,local_98);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,0x10);
    }
  }
  piVar1 = (int *)CONCAT44(uStack_64,local_68);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_64,local_68),2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QDateTimePrivate::ZoneState QTimeZonePrivate::stateAtZoneTime(
    qint64 forLocalMSecs, QDateTimePrivate::TransitionOptions resolve) const
{
    auto dataToState = [](const Data &d) {
        return QDateTimePrivate::ZoneState(d.atMSecsSinceEpoch + d.offsetFromUtc * 1000,
                                           d.offsetFromUtc,
                                           d.daylightTimeOffset ? QDateTimePrivate::DaylightTime
                                                                : QDateTimePrivate::StandardTime);
    };

    /*
      We need a UTC time at which to ask for the offset, in order to be able to
      add that offset to forLocalMSecs, to get the UTC time we need.
      Fortunately, all time-zone offsets have been less than 17 hours; and DST
      transitions happen (much) more than thirty-four hours apart. So sampling
      offset seventeen hours each side gives us information we can be sure
      brackets the correct time and at most one DST transition.
    */
    std::integral_constant<qint64, 17 * 3600 * 1000> seventeenHoursInMSecs;
    static_assert(-seventeenHoursInMSecs / 1000 < QTimeZone::MinUtcOffsetSecs
                  && seventeenHoursInMSecs / 1000 > QTimeZone::MaxUtcOffsetSecs);
    qint64 millis;
    // Clip the bracketing times to the bounds of the supported range.
    const qint64 recent =
        qSubOverflow(forLocalMSecs, seventeenHoursInMSecs, &millis) || millis < minMSecs()
        ? minMSecs() : millis; // Necessarily <= forLocalMSecs + 1.
    // (Given that minMSecs() is std::numeric_limits<qint64>::min() + 1.)
    const qint64 imminent =
        qAddOverflow(forLocalMSecs, seventeenHoursInMSecs, &millis)
        ? maxMSecs() : millis; // Necessarily >= forLocalMSecs
    // At most one of those was clipped to its boundary value:
    Q_ASSERT(recent < imminent && seventeenHoursInMSecs < imminent - recent + 1);

    const Data past = data(recent), future = data(imminent);
    if (future.atMSecsSinceEpoch == invalidMSecs()
        && past.atMSecsSinceEpoch == invalidMSecs()) {
        // Failed to get any useful data near this time: apparently out of range
        // for the backend.
        return { forLocalMSecs };
    }
    // > 99% of the time, past and future will agree:
    if (Q_LIKELY(past.offsetFromUtc == future.offsetFromUtc
                 && past.standardTimeOffset == future.standardTimeOffset
                 // Those two imply same daylightTimeOffset.
                 && past.abbreviation == future.abbreviation)) {
        Data data = future;
        data.atMSecsSinceEpoch = forLocalMSecs - future.offsetFromUtc * 1000;
        return dataToState(data);
    }

    /*
      Offsets are Local - UTC, positive to the east of Greenwich, negative to
      the west; DST offset normally exceeds standard offset, when DST applies.
      When we have offsets on either side of a transition, the lower one is
      standard, the higher is DST, unless we have data telling us it's the other
      way round.

      Non-DST transitions (jurisdictions changing time-zone and time-zones
      changing their standard offset, typically) are described below as if they
      were DST transitions (since these are more usual and familiar); the code
      mostly concerns itself with offsets from UTC, described in terms of the
      common case for changes in that.  If there is no actual change in offset
      (e.g. a DST transition cancelled by a standard offset change), this code
      should handle it gracefully; without transitions, it'll see early == late
      and take the easy path; with transitions, tran and nextTran get the
      correct UTC time as atMSecsSinceEpoch so comparing to nextStart selects
      the right one.  In all other cases, the transition changes offset and the
      reasoning that applies to DST applies just the same.

      The resolution of transitions, specified by \a resolve, may be lead astray
      if (as happens on Windows) the backend has been obliged to guess whether a
      transition is in fact a DST one or a change to standard offset; or to
      guess that the higher-offset side is the DST one (the reverse of this is
      true for Ireland, using negative DST). There's not much we can do about
      that, though.
    */
    if (hasTransitions()) {
        /*
          We have transitions.

          Each transition gives the offsets to use until the next; so we need
          the most recent transition before the time forLocalMSecs describes. If
          it describes a time *in* a transition, we'll need both that transition
          and the one before it. So find one transition that's probably after
          (and not much before, otherwise) and another that's definitely before,
          then work out which one to use. When both or neither work on
          forLocalMSecs, use resolve to disambiguate.
        */

        // Get a transition definitely before the local MSecs; usually all we need.
        // Only around the transition times might we need another.
        Data tran = past; // Data after last transition before our window.
        Q_ASSERT(forLocalMSecs < 0 || // Pre-epoch TZ info may be unavailable
                 forLocalMSecs - tran.offsetFromUtc * 1000 >= tran.atMSecsSinceEpoch);
        // If offset actually exceeds 17 hours, that assert may trigger.
        Data nextTran = nextTransition(tran.atMSecsSinceEpoch);
        /*
          Now walk those forward until they bracket forLocalMSecs with transitions.

          One of the transitions should then be telling us the right offset to use.
          In a transition, we need the transition before it (to describe the run-up
          to the transition) and the transition itself; so we need to stop when
          nextTran is (invalid or) that transition.
        */
        while (nextTran.atMSecsSinceEpoch != invalidMSecs()
               && forLocalMSecs > nextTran.atMSecsSinceEpoch + nextTran.offsetFromUtc * 1000) {
            Data newTran = nextTransition(nextTran.atMSecsSinceEpoch);
            if (newTran.atMSecsSinceEpoch == invalidMSecs()
                || newTran.atMSecsSinceEpoch + newTran.offsetFromUtc * 1000 > imminent) {
                // Definitely not a relevant tansition: too far in the future.
                break;
            }
            tran = nextTran;
            nextTran = newTran;
        }
        const qint64 nextStart = nextTran.atMSecsSinceEpoch;

        // Check we do *really* have transitions for this zone:
        if (tran.atMSecsSinceEpoch != invalidMSecs()) {
            /* So now tran is definitely before ... */
            Q_ASSERT(forLocalMSecs < 0
                     || forLocalMSecs - tran.offsetFromUtc * 1000 > tran.atMSecsSinceEpoch);
            // Work out the UTC value it would make sense to return if using tran:
            tran.atMSecsSinceEpoch = forLocalMSecs - tran.offsetFromUtc * 1000;

            // If there are no transition after it, the answer is easy - or
            // should be - but Darwin's handling of the distant future (in macOS
            // 15, QTBUG-126391) runs out of transitions in 506'712 CE, despite
            // knowing about offset changes long after that. So only trust the
            // easy answer if offsets match; otherwise, fall through to the
            // transitions-unknown code.
            if (nextStart == invalidMSecs() && tran.offsetFromUtc == future.offsetFromUtc)
                return dataToState(tran); // Last valid transition.
        }

        if (tran.atMSecsSinceEpoch != invalidMSecs() && nextStart != invalidMSecs()) {
            /*
              ... and nextTran is either after or only slightly before. We're
              going to interpret one as standard time, the other as DST
              (although the transition might in fact be a change in standard
              offset, or a change in DST offset, e.g. to/from double-DST).

              Usually exactly one of those shall be relevant and we'll use it;
              but if we're close to nextTran we may be in a transition, to be
              settled according to resolve's rules.
            */
            // Work out the UTC value it would make sense to return if using nextTran:
            nextTran.atMSecsSinceEpoch = forLocalMSecs - nextTran.offsetFromUtc * 1000;

            bool fallBack = false;
            if (nextStart > nextTran.atMSecsSinceEpoch) {
                // If both UTC values are before nextTran's offset applies, use tran:
                if (nextStart > tran.atMSecsSinceEpoch)
                    return dataToState(tran);

                Q_ASSERT(tran.offsetFromUtc < nextTran.offsetFromUtc);
                // We're in a spring-forward.
            } else if (nextStart <= tran.atMSecsSinceEpoch) {
                // Both UTC values say we should be using nextTran:
                return dataToState(nextTran);
            } else {
                Q_ASSERT(nextTran.offsetFromUtc < tran.offsetFromUtc);
                fallBack = true; // We're in a fall-back.
            }
            // (forLocalMSecs - nextStart) / 1000 lies between the two offsets.

            // Apply resolve:
            // Determine whether FlipForReverseDst affects the outcome:
            const bool flipped
                = resolve.testFlag(QDateTimePrivate::FlipForReverseDst)
                && (fallBack ? !tran.daylightTimeOffset && nextTran.daylightTimeOffset
                             : tran.daylightTimeOffset && !nextTran.daylightTimeOffset);

            if (fallBack) {
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::FoldUseBefore
                                     : QDateTimePrivate::FoldUseAfter)) {
                    return dataToState(nextTran);
                }
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::FoldUseAfter
                                     : QDateTimePrivate::FoldUseBefore)) {
                    return dataToState(tran);
                }
            } else {
                /* Neither is valid (e.g. in a spring-forward's gap) and
                   nextTran.atMSecsSinceEpoch < nextStart <= tran.atMSecsSinceEpoch.
                   So swap their atMSecsSinceEpoch to give each a moment on the
                   side of the transition that it describes, then select the one
                   after or before according to the option set:
                */
                std::swap(tran.atMSecsSinceEpoch, nextTran.atMSecsSinceEpoch);
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::GapUseBefore
                                     : QDateTimePrivate::GapUseAfter))
                    return dataToState(nextTran);
                if (resolve.testFlag(flipped
                                     ? QDateTimePrivate::GapUseAfter
                                     : QDateTimePrivate::GapUseBefore))
                    return dataToState(tran);
            }
            // Reject
            return {forLocalMSecs};
        }
        // Before first transition, or system has transitions but not for this zone.
        // Try falling back to offsetFromUtc (works for before first transition, at least).
    }

    /* Bracket and refine to discover offset. */
    qint64 utcEpochMSecs;

    // We don't have true data on DST-ness, so can't apply FlipForReverseDst.
    int early = past.offsetFromUtc;
    int late = future.offsetFromUtc;
    if (early == late || late == invalidSeconds()) {
        if (early == invalidSeconds()
            || qSubOverflow(forLocalMSecs, early * qint64(1000), &utcEpochMSecs)) {
            return {forLocalMSecs}; // Outside representable range
        }
    } else {
        // Candidate values for utcEpochMSecs (if forLocalMSecs is valid):
        const qint64 forEarly = forLocalMSecs - early * 1000;
        const qint64 forLate = forLocalMSecs - late * 1000;
        // If either of those doesn't have the offset we got it from, it's on
        // the wrong side of the transition (and both may be, for a gap):
        const bool earlyOk = offsetFromUtc(forEarly) == early;
        const bool lateOk = offsetFromUtc(forLate) == late;

        if (earlyOk) {
            if (lateOk) {
                Q_ASSERT(early > late);
                // fall-back's repeated interval
                if (resolve.testFlag(QDateTimePrivate::FoldUseBefore))
                    utcEpochMSecs = forEarly;
                else if (resolve.testFlag(QDateTimePrivate::FoldUseAfter))
                    utcEpochMSecs = forLate;
                else
                    return {forLocalMSecs};
            } else {
                // Before and clear of the transition:
                utcEpochMSecs = forEarly;
            }
        } else if (lateOk) {
            // After and clear of the transition:
            utcEpochMSecs = forLate;
        } else {
            // forLate <= gap < forEarly
            Q_ASSERT(late > early);
            const int dstStep = (late - early) * 1000;
            if (resolve.testFlag(QDateTimePrivate::GapUseBefore))
                utcEpochMSecs = forEarly - dstStep;
            else if (resolve.testFlag(QDateTimePrivate::GapUseAfter))
                utcEpochMSecs = forLate + dstStep;
            else
                return {forLocalMSecs};
        }
    }

    return dataToState(data(utcEpochMSecs));
}